

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O1

void __thiscall
duckdb::PiecewiseMergeJoinState::ResolveJoinKeys(PiecewiseMergeJoinState *this,DataChunk *input)

{
  unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true> *this_00;
  unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
  *puVar1;
  bool bVar2;
  ClientContext *pCVar3;
  _Head_base<0UL,_duckdb::GlobalSortState_*,_false> __ptr_00;
  PhysicalPiecewiseMergeJoin *op;
  _Head_base<0UL,_duckdb::PhysicalRangeJoin::LocalSortedTable_*,_false> __ptr_01;
  _Head_base<0UL,_duckdb::PayloadScanner_*,_false> __ptr_02;
  _Head_base<0UL,_duckdb::GlobalSortState_*,_false> this_01;
  _Head_base<0UL,_duckdb::PhysicalRangeJoin::LocalSortedTable_*,_false> this_02;
  pointer pLVar4;
  type pGVar5;
  pointer pGVar6;
  reference this_03;
  pointer pSVar7;
  type sorted_data;
  _Head_base<0UL,_duckdb::PayloadScanner_*,_false> this_04;
  pointer this_05;
  pointer pLVar8;
  DataChunk *this_06;
  pointer *__ptr;
  pointer *__ptr_3;
  pointer *__ptr_2;
  pointer __p;
  pointer __p_2;
  MergeSorter merge_sorter;
  undefined1 local_78 [24];
  _Head_base<0UL,_duckdb::SBScanState_*,_false> local_60;
  _Head_base<0UL,_duckdb::SBScanState_*,_false> local_58;
  _Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_> local_50;
  _Head_base<0UL,_duckdb::SortedBlock_*,_false> local_48;
  unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
  *local_38;
  
  pCVar3 = this->context;
  this_01._M_head_impl = (GlobalSortState *)operator_new(0x2b8);
  GlobalSortState::GlobalSortState(this_01._M_head_impl,pCVar3,&this->lhs_order,&this->lhs_layout);
  this_00 = &this->lhs_global_state;
  local_78._0_8_ = (GlobalSortState *)0x0;
  __ptr_00._M_head_impl =
       (this->lhs_global_state).
       super_unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalSortState_*,_std::default_delete<duckdb::GlobalSortState>_>
       .super__Head_base<0UL,_duckdb::GlobalSortState_*,_false>._M_head_impl;
  (this->lhs_global_state).
  super_unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>._M_t.
  super___uniq_ptr_impl<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::GlobalSortState_*,_std::default_delete<duckdb::GlobalSortState>_>.
  super__Head_base<0UL,_duckdb::GlobalSortState_*,_false>._M_head_impl = this_01._M_head_impl;
  if (__ptr_00._M_head_impl != (GlobalSortState *)0x0) {
    ::std::default_delete<duckdb::GlobalSortState>::operator()
              ((default_delete<duckdb::GlobalSortState> *)this_00,__ptr_00._M_head_impl);
  }
  if ((GlobalSortState *)local_78._0_8_ != (GlobalSortState *)0x0) {
    ::std::default_delete<duckdb::GlobalSortState>::operator()
              ((default_delete<duckdb::GlobalSortState> *)local_78,(GlobalSortState *)local_78._0_8_
              );
  }
  pCVar3 = this->context;
  op = this->op;
  this_02._M_head_impl = (LocalSortedTable *)operator_new(0x170);
  PhysicalRangeJoin::LocalSortedTable::LocalSortedTable
            (this_02._M_head_impl,pCVar3,&op->super_PhysicalRangeJoin,0);
  puVar1 = &this->lhs_local_table;
  local_78._0_8_ = (GlobalSortState *)0x0;
  __ptr_01._M_head_impl =
       (this->lhs_local_table).
       super_unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PhysicalRangeJoin::LocalSortedTable_*,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>_>
       .super__Head_base<0UL,_duckdb::PhysicalRangeJoin::LocalSortedTable_*,_false>._M_head_impl;
  (this->lhs_local_table).
  super_unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PhysicalRangeJoin::LocalSortedTable_*,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>_>
  .super__Head_base<0UL,_duckdb::PhysicalRangeJoin::LocalSortedTable_*,_false>._M_head_impl =
       this_02._M_head_impl;
  if (__ptr_01._M_head_impl != (LocalSortedTable *)0x0) {
    ::std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>::operator()
              ((default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable> *)puVar1,
               __ptr_01._M_head_impl);
  }
  if ((GlobalSortState *)local_78._0_8_ != (GlobalSortState *)0x0) {
    ::std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>::operator()
              ((default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable> *)local_78,
               (LocalSortedTable *)local_78._0_8_);
  }
  pLVar4 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
           ::operator->(puVar1);
  pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator*(this_00);
  PhysicalRangeJoin::LocalSortedTable::Sink(pLVar4,input,pGVar5);
  bVar2 = this->force_external;
  pGVar6 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(this_00);
  pGVar6->external = bVar2;
  pGVar6 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(this_00);
  local_38 = puVar1;
  pLVar4 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
           ::operator->(puVar1);
  GlobalSortState::AddLocalState(pGVar6,&pLVar4->local_sort_state);
  pGVar6 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(this_00);
  GlobalSortState::PrepareMergePhase(pGVar6);
  pGVar6 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(this_00);
  if (8 < (ulong)((long)(pGVar6->sorted_blocks).
                        super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pGVar6->sorted_blocks).
                       super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    do {
      pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
               ::operator*(this_00);
      MergeSorter::MergeSorter((MergeSorter *)local_78,pGVar5,this->buffer_manager);
      MergeSorter::PerformInMergeRound((MergeSorter *)local_78);
      pGVar6 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
               ::operator->(this_00);
      GlobalSortState::CompleteMergeRound(pGVar6,false);
      if (local_48._M_head_impl != (SortedBlock *)0x0) {
        ::std::default_delete<duckdb::SortedBlock>::operator()
                  ((default_delete<duckdb::SortedBlock> *)&local_48,local_48._M_head_impl);
      }
      local_48._M_head_impl = (SortedBlock *)0x0;
      if (local_50.super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl !=
          (SortedBlock *)0x0) {
        ::std::default_delete<duckdb::SortedBlock>::operator()
                  ((default_delete<duckdb::SortedBlock> *)&local_50,
                   (SortedBlock *)
                   local_50.super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl);
      }
      local_50.super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::SortedBlock_*,_false>)(SortedBlock *)0x0;
      if (local_58._M_head_impl != (SBScanState *)0x0) {
        ::std::default_delete<duckdb::SBScanState>::operator()
                  ((default_delete<duckdb::SBScanState> *)&local_58,local_58._M_head_impl);
      }
      local_58._M_head_impl = (SBScanState *)0x0;
      if (local_60._M_head_impl != (SBScanState *)0x0) {
        ::std::default_delete<duckdb::SBScanState>::operator()
                  ((default_delete<duckdb::SBScanState> *)&local_60,local_60._M_head_impl);
      }
      pGVar6 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
               ::operator->(this_00);
    } while (8 < (ulong)((long)(pGVar6->sorted_blocks).
                               super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pGVar6->sorted_blocks).
                              super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start));
  }
  pGVar6 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(this_00);
  this_03 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
            ::operator[](&pGVar6->sorted_blocks,0);
  pSVar7 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
           operator->(this_03);
  sorted_data = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                operator*(&pSVar7->payload_data);
  pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator*(this_00);
  this_04._M_head_impl = (PayloadScanner *)operator_new(0x18);
  PayloadScanner::PayloadScanner(this_04._M_head_impl,sorted_data,pGVar5,true);
  local_78._0_8_ = (GlobalSortState *)0x0;
  __ptr_02._M_head_impl =
       (this->scanner).
       super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>._M_t.
       super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>
       .super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl;
  (this->scanner).
  super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>._M_t.
  super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>.
  super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl = this_04._M_head_impl;
  if (__ptr_02._M_head_impl != (PayloadScanner *)0x0) {
    ::std::default_delete<duckdb::PayloadScanner>::operator()
              ((default_delete<duckdb::PayloadScanner> *)&this->scanner,__ptr_02._M_head_impl);
  }
  puVar1 = local_38;
  if ((GlobalSortState *)local_78._0_8_ != (GlobalSortState *)0x0) {
    ::std::default_delete<duckdb::PayloadScanner>::operator()
              ((default_delete<duckdb::PayloadScanner> *)local_78,(PayloadScanner *)local_78._0_8_);
  }
  this_06 = &this->lhs_payload;
  DataChunk::Reset(this_06);
  this_05 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
            operator->(&this->scanner);
  PayloadScanner::Scan(this_05,this_06);
  pLVar4 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
           ::operator->(puVar1);
  DataChunk::Reset(&pLVar4->keys);
  pLVar4 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
           ::operator->(puVar1);
  pLVar8 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
           ::operator->(puVar1);
  ExpressionExecutor::Execute(&pLVar4->executor,this_06,&pLVar8->keys);
  return;
}

Assistant:

void ResolveJoinKeys(DataChunk &input) {
		// sort by join key
		lhs_global_state = make_uniq<GlobalSortState>(context, lhs_order, lhs_layout);
		lhs_local_table = make_uniq<LocalSortedTable>(context, op, 0U);
		lhs_local_table->Sink(input, *lhs_global_state);

		// Set external (can be forced with the PRAGMA)
		lhs_global_state->external = force_external;
		lhs_global_state->AddLocalState(lhs_local_table->local_sort_state);
		lhs_global_state->PrepareMergePhase();
		while (lhs_global_state->sorted_blocks.size() > 1) {
			MergeSorter merge_sorter(*lhs_global_state, buffer_manager);
			merge_sorter.PerformInMergeRound();
			lhs_global_state->CompleteMergeRound();
		}

		// Scan the sorted payload
		D_ASSERT(lhs_global_state->sorted_blocks.size() == 1);

		scanner = make_uniq<PayloadScanner>(*lhs_global_state->sorted_blocks[0]->payload_data, *lhs_global_state);
		lhs_payload.Reset();
		scanner->Scan(lhs_payload);

		// Recompute the sorted keys from the sorted input
		lhs_local_table->keys.Reset();
		lhs_local_table->executor.Execute(lhs_payload, lhs_local_table->keys);
	}